

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_skl_motion.cxx
# Opt level: O2

void __thiscall read_bm_0::operator()(read_bm_0 *this,xr_bone_motion **bm,xr_reader *r)

{
  xr_bone_motion *this_00;
  char name [8];
  
  this->index = this->index + 1;
  snprintf(name,8,"%d");
  this_00 = (xr_bone_motion *)operator_new(0x60);
  xray_re::xr_bone_motion::xr_bone_motion(this_00,name);
  *bm = this_00;
  xray_re::xr_bone_motion::load_0(this_00,r);
  return;
}

Assistant:

void operator()(xr_bone_motion*& bm, xr_reader& r) {
		char name[8];
		xr_snprintf(name, sizeof(name), "%d", index++);
		bm = new xr_bone_motion(name);
		bm->load_0(r);
	}